

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_wfi_arm(CPUARMState *env,uint32_t insn_len)

{
  CPUState *cpu;
  ulong uVar1;
  code *pcVar2;
  char cVar3;
  uint uVar4;
  uint64_t uVar5;
  uint uVar6;
  uint32_t target_el;
  long lVar7;
  
  uVar1 = env->features;
  target_el = 0;
  uVar4 = (uint)uVar1;
  if ((uVar4 >> 9 & 1) != 0) goto LAB_00597be1;
  if (env->aarch64 == 0) {
    uVar6 = env->uncached_cpsr & 0x1f;
    if (uVar6 == 0x10) goto switchD_00597b55_caseD_0;
    if (uVar6 == 0x16) goto switchD_00597b55_caseD_3;
    if (uVar6 == 0x1a) goto switchD_00597b55_caseD_2;
    if ((uVar1 >> 0x21 & 1) == 0) goto switchD_00597b55_caseD_1;
    if (uVar6 == 0x16) {
      if ((uVar4 >> 0x1c & 1) != 0) goto switchD_00597b55_caseD_1;
    }
    else if ((uVar1 & 0x10000000) != 0 || ((env->cp15).scr_el3 & 1) != 0)
    goto switchD_00597b55_caseD_1;
  }
  else {
    switch(env->pstate >> 2 & 3) {
    case 0:
switchD_00597b55_caseD_0:
      if ((uVar4 >> 0x1b & 1) != 0) {
        if (((uVar1 >> 0x21 & 1) == 0) ||
           ((uVar1 & 0x10000000) != 0 || ((env->cp15).scr_el3 & 1) != 0)) {
          lVar7 = 1;
        }
        else {
          lVar7 = 3;
        }
        target_el = (uint32_t)lVar7;
        if ((*(byte *)((long)(env->cp15).cptr_el + lVar7 * 8 + -0x26) & 1) == 0) goto LAB_00597be1;
      }
switchD_00597b55_caseD_1:
      uVar5 = arm_hcr_el2_eff_arm(env);
      target_el = 2;
      if (((uint)uVar5 >> 0xd & 1) != 0) goto LAB_00597be1;
      break;
    case 1:
      goto switchD_00597b55_caseD_1;
    case 3:
      goto switchD_00597b55_caseD_3;
    }
switchD_00597b55_caseD_2:
    target_el = 3;
    if (((env->cp15).scr_el3 & 0x1000) != 0) goto LAB_00597be1;
  }
switchD_00597b55_caseD_3:
  target_el = 0;
LAB_00597be1:
  pcVar2 = *(code **)(env[-2].xregs[0x1c] + 8);
  if (pcVar2 == (code *)0x0) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
               ,0x1bc,"cc->has_work");
  }
  cpu = (CPUState *)(env[-10].cp15.c14_pmevcntr + 0x1b);
  cVar3 = (*pcVar2)(cpu);
  if (cVar3 == '\0') {
    if (target_el != 0) {
      if (env->aarch64 == 0) {
        env->regs[0xf] = env->regs[0xf] - insn_len;
      }
      else {
        env->pc = env->pc - (ulong)insn_len;
      }
      raise_exception_arm(env,1,(uint)(insn_len != 2) << 0x19 | 0x5e00000,target_el);
    }
    *(undefined4 *)(env[-2].xregs + 0x1a) = 0x10001;
    *(undefined4 *)(env[-2].xregs + 0x19) = 1;
    cpu_loop_exit_arm(cpu);
  }
  return;
}

Assistant:

void HELPER(wfi)(CPUARMState *env, uint32_t insn_len)
{
    CPUState *cs = env_cpu(env);
    int target_el = check_wfx_trap(env, false);

    if (cpu_has_work(cs)) {
        /* Don't bother to go into our "low power state" if
         * we would just wake up immediately.
         */
        return;
    }

    if (target_el) {
        if (env->aarch64) {
            env->pc -= insn_len;
        } else {
            env->regs[15] -= insn_len;
        }

        raise_exception(env, EXCP_UDEF, syn_wfx(1, 0xe, 0, insn_len == 2),
                        target_el);
    }

    cs->exception_index = EXCP_HLT;
    cs->halted = 1;
    cpu_loop_exit(cs);
}